

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O1

void roguecorr(level *lev,int x,int y,int dir)

{
  undefined1 *puVar1;
  long lVar2;
  byte *pbVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  rogueroom *prVar14;
  int iVar15;
  ulong uVar16;
  char *s;
  uint uVar17;
  int iVar18;
  int iVar19;
  
  if (dir == 8) {
    lVar11 = (long)y;
    prVar14 = r[x] + lVar11;
    prVar14->doortable = prVar14->doortable & 0xf7;
    cVar4 = prVar14->rlx;
    if (prVar14->real == '\0') {
      iVar15 = (int)cVar4 + x * 0x1a + 1;
      uVar8 = y * 7 + (int)prVar14->rly;
    }
    else {
      cVar5 = prVar14->dx;
      cVar6 = prVar14->rly;
      cVar7 = prVar14->dy;
      uVar8 = mt_random();
      iVar15 = (int)cVar5 + (int)cVar4 + x * 0x1a;
      uVar9 = iVar15 + 1;
      uVar8 = y * 7 + (int)cVar6 + SUB164(ZEXT416(uVar8) % SEXT816((long)cVar7),0);
      cVar4 = lev->locations[(int)uVar9][(int)uVar8].typ;
      if (cVar4 == '\0' || '\f' < cVar4) {
        impossible("down: no wall at %d,%d?",(ulong)uVar9,(ulong)uVar8);
      }
      dodoor(lev,uVar9,uVar8,lev->rooms + prVar14->nroom);
      puVar1 = &lev->locations[(int)uVar9][(int)uVar8].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
      iVar15 = iVar15 + 2;
    }
    if (x < 2) {
      iVar19 = x + 1;
      lVar10 = (long)iVar19;
      lVar2 = lVar10 * 0x24;
      pbVar3 = (byte *)(lVar2 + 0x327d15 + lVar11 * 0xc);
      *pbVar3 = *pbVar3 & 0xfb;
      iVar18 = (int)r[lVar10][lVar11].rlx;
      iVar13 = (int)*(char *)(lVar2 + 0x327d11 + lVar11 * 0xc);
      if (*(char *)(lVar2 + 0x327d14 + lVar11 * 0xc) == '\0') {
        uVar9 = iVar18 + iVar19 * 0x1a + 1;
        uVar17 = y * 7 + iVar13;
      }
      else {
        cVar4 = r[lVar10][lVar11].dy;
        uVar17 = mt_random();
        uVar9 = iVar19 * 0x1a + iVar18;
        uVar17 = y * 7 + iVar13 + SUB164(ZEXT416(uVar17) % SEXT816((long)cVar4),0);
        cVar4 = lev->locations[(int)uVar9][(int)uVar17].typ;
        if (cVar4 == '\0' || '\f' < cVar4) {
          impossible("left: no wall at %d,%d?",(ulong)uVar9,(ulong)uVar17);
        }
        dodoor(lev,uVar9,uVar17,lev->rooms + r[lVar10][lVar11].nroom);
        puVar1 = &lev->locations[(int)uVar9][(int)uVar17].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
        uVar9 = uVar9 - 1;
      }
      iVar18 = 1;
      goto LAB_0019e688;
    }
    s = "right door from %d,%d going nowhere?";
    uVar16 = 2;
    uVar12 = (ulong)(uint)y;
  }
  else {
    if (dir != 2) {
      impossible("corridor in direction %d?",(ulong)(uint)dir);
      return;
    }
    prVar14 = r[x] + y;
    prVar14->doortable = prVar14->doortable & 0xfd;
    cVar4 = prVar14->rlx;
    if (prVar14->real == '\0') {
      iVar15 = x * 0x1a + (int)cVar4 + 1;
      uVar8 = y * 7 + (int)prVar14->rly;
    }
    else {
      cVar5 = prVar14->dx;
      uVar8 = mt_random();
      iVar15 = SUB164(ZEXT416(uVar8) % SEXT816((long)cVar5),0) + (int)cVar4 + x * 0x1a + 1;
      uVar8 = y * 7 + (int)prVar14->rly + (int)prVar14->dy;
      cVar4 = lev->locations[iVar15][(int)uVar8].typ;
      if (cVar4 == '\0' || '\f' < cVar4) {
        impossible("down: no wall at %d,%d?",iVar15,(ulong)uVar8);
      }
      dodoor(lev,iVar15,uVar8,lev->rooms + prVar14->nroom);
      puVar1 = &lev->locations[iVar15][(int)uVar8].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
      uVar8 = uVar8 + 1;
    }
    if (y < 2) {
      iVar18 = y + 1;
      prVar14 = r[x] + iVar18;
      prVar14->doortable = prVar14->doortable & 0xfe;
      cVar4 = prVar14->rlx;
      if (prVar14->real == '\0') {
        uVar9 = x * 0x1a + (int)cVar4 + 1;
        uVar17 = iVar18 * 7 + (int)prVar14->rly;
      }
      else {
        cVar5 = prVar14->dx;
        uVar9 = mt_random();
        uVar9 = SUB164(ZEXT416(uVar9) % SEXT816((long)cVar5),0) + (int)cVar4 + x * 0x1a + 1;
        iVar18 = iVar18 * 7 + (int)prVar14->rly;
        uVar17 = iVar18 - 1;
        cVar4 = lev->locations[(int)uVar9][(int)uVar17].typ;
        if (cVar4 == '\0' || '\f' < cVar4) {
          impossible("up: no wall at %d,%d?",(ulong)uVar9,(ulong)uVar17);
        }
        dodoor(lev,uVar9,uVar17,lev->rooms + prVar14->nroom);
        puVar1 = &lev->locations[(int)uVar9][(int)uVar17].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
        uVar17 = iVar18 - 2;
      }
      iVar18 = 0;
LAB_0019e688:
      roguejoin(lev,iVar15,uVar8,uVar9,uVar17,iVar18);
      return;
    }
    s = "down door from %d,%d going nowhere?";
    uVar16 = (ulong)(uint)x;
    uVar12 = 2;
  }
  impossible(s,uVar16,uVar12);
  return;
}

Assistant:

static void roguecorr(struct level *lev, int x, int y, int dir)
{
	int fromx, fromy, tox, toy;

	if (dir==DOWN) {
		r[x][y].doortable &= ~DOWN;
		if (!r[x][y].real) {
			fromx = r[x][y].rlx; fromy = r[x][y].rly;
			fromx += 1 + 26*x; fromy += 7*y;
		} else {
			fromx = r[x][y].rlx + rn2(r[x][y].dx);
			fromy = r[x][y].rly + r[x][y].dy;
			fromx += 1 + 26*x; fromy += 7*y;
			if (!IS_WALL(lev->locations[fromx][fromy].typ))
				impossible("down: no wall at %d,%d?",fromx,
									fromy);
			dodoor(lev, fromx, fromy, &lev->rooms[r[x][y].nroom]);
			lev->locations[fromx][fromy].doormask = D_NODOOR;
			fromy++;
		}
		if (y >= 2) {
			impossible("down door from %d,%d going nowhere?",x,y);
			return;
		}
		y++;
		r[x][y].doortable &= ~UP;
		if (!r[x][y].real) {
			tox = r[x][y].rlx; toy = r[x][y].rly;
			tox += 1 + 26*x; toy += 7*y;
		} else {
			tox = r[x][y].rlx + rn2(r[x][y].dx);
			toy = r[x][y].rly - 1;
			tox += 1 + 26*x; toy += 7*y;
			if (!IS_WALL(lev->locations[tox][toy].typ))
				impossible("up: no wall at %d,%d?",tox,toy);
			dodoor(lev, tox, toy, &lev->rooms[r[x][y].nroom]);
			lev->locations[tox][toy].doormask = D_NODOOR;
			toy--;
		}
		roguejoin(lev, fromx, fromy, tox, toy, FALSE);
		return;
	} else if (dir == RIGHT) {
		r[x][y].doortable &= ~RIGHT;
		if (!r[x][y].real) {
			fromx = r[x][y].rlx; fromy = r[x][y].rly;
			fromx += 1 + 26*x; fromy += 7*y;
		} else {
			fromx = r[x][y].rlx + r[x][y].dx;
			fromy = r[x][y].rly + rn2(r[x][y].dy);
			fromx += 1 + 26*x; fromy += 7*y;
			if (!IS_WALL(lev->locations[fromx][fromy].typ))
				impossible("down: no wall at %d,%d?",fromx,
									fromy);
			dodoor(lev, fromx, fromy, &lev->rooms[r[x][y].nroom]);
			lev->locations[fromx][fromy].doormask = D_NODOOR;
			fromx++;
		}
		if (x >= 2) {
			impossible("right door from %d,%d going nowhere?",x,y);
			return;
		}
		x++;
		r[x][y].doortable &= ~LEFT;
		if (!r[x][y].real) {
			tox = r[x][y].rlx; toy = r[x][y].rly;
			tox += 1 + 26*x; toy += 7*y;
		} else {
			tox = r[x][y].rlx - 1;
			toy = r[x][y].rly + rn2(r[x][y].dy);
			tox += 1 + 26*x; toy += 7*y;
			if (!IS_WALL(lev->locations[tox][toy].typ))
				impossible("left: no wall at %d,%d?",tox,toy);
			dodoor(lev, tox, toy, &lev->rooms[r[x][y].nroom]);
			lev->locations[tox][toy].doormask = D_NODOOR;
			tox--;
		}
		roguejoin(lev, fromx, fromy, tox, toy, TRUE);
		return;
	} else impossible("corridor in direction %d?",dir);
}